

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O0

VertexAndFaceArraysPtr __thiscall
graphics101::vao::makeSquare(vao *this,GLint position_location,GLint texcoord_location)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VertexAndFaceArraysPtr VVar2;
  vec<3,_int,_(glm::qualifier)0> local_d8;
  vec<3,_int,_(glm::qualifier)0> local_cc;
  undefined1 local_c0 [8];
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  F;
  value_type local_a0;
  value_type local_98;
  value_type local_90;
  undefined1 local_88 [8];
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  TC;
  value_type local_64;
  value_type local_58 [2];
  value_type local_3c;
  undefined1 local_30 [8];
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  V;
  GLint texcoord_location_local;
  GLint position_location_local;
  VertexAndFaceArraysPtr *vao;
  
  V.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = texcoord_location;
  V.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = position_location;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_30);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_3c,-1,-1,0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_30,&local_3c);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)local_58,1,-1,0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_30,local_58);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_64,1,1,0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_30,&local_64);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)
             &TC.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,-1,1,0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_30,
              (value_type *)
              &TC.
               super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)local_88);
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>((vec<2,float,(glm::qualifier)0> *)&local_90,0,0)
  ;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_88,&local_90);
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>((vec<2,float,(glm::qualifier)0> *)&local_98,1,0)
  ;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_88,&local_98);
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>((vec<2,float,(glm::qualifier)0> *)&local_a0,1,1)
  ;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_88,&local_a0);
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>
            ((vec<2,float,(glm::qualifier)0> *)
             &F.
              super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
               *)local_88,
              (value_type *)
              &F.
               super__Vector_base<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
            *)local_c0);
  glm::vec<3,_int,_(glm::qualifier)0>::vec(&local_cc,0,1,2);
  std::
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               *)local_c0,&local_cc);
  glm::vec<3,_int,_(glm::qualifier)0>::vec(&local_d8,0,2,3);
  std::
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
               *)local_c0,&local_d8);
  VertexAndFaceArrays::makePtr();
  peVar1 = std::
           __shared_ptr_access<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  VertexAndFaceArrays::uploadAttribute
            (peVar1,(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)local_30,
             V.
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  peVar1 = std::
           __shared_ptr_access<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  VertexAndFaceArrays::uploadAttribute
            (peVar1,(vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                     *)local_88,
             (GLint)V.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  peVar1 = std::
           __shared_ptr_access<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  VertexAndFaceArrays::uploadFaces
            (peVar1,(vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
                     *)local_c0);
  std::
  vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_int,_(glm::qualifier)0>_>_>
             *)local_c0);
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             *)local_88);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)local_30);
  VVar2.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  VVar2.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VertexAndFaceArraysPtr)
         VVar2.super___shared_ptr<graphics101::VertexAndFaceArrays,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VertexAndFaceArrays::VertexAndFaceArraysPtr makeSquare( GLint position_location, GLint texcoord_location )
{
    std::vector< vec3 > V;
    V.push_back( vec3( -1, -1, 0 ) );
    V.push_back( vec3(  1, -1, 0 ) );
    V.push_back( vec3(  1,  1, 0 ) );
    V.push_back( vec3( -1,  1, 0 ) );
    
    std::vector< vec2 > TC;
    TC.push_back( vec2( 0, 0 ) );
    TC.push_back( vec2( 1, 0 ) );
    TC.push_back( vec2( 1, 1 ) );
    TC.push_back( vec2( 0, 1 ) );
    
    std::vector< ivec3 > F;
    F.push_back( ivec3( 0, 1, 2 ) );
    F.push_back( ivec3( 0, 2, 3 ) );
    
    auto vao = VertexAndFaceArrays::makePtr();
    vao->uploadAttribute( V, position_location );
    vao->uploadAttribute( TC, texcoord_location );
    vao->uploadFaces( F );
    return vao;
}